

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

void graph_vis(t_gobj *gr,_glist *parent_glist,int vis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _rtext *p_Var5;
  _glist *p_Var6;
  char *anchor;
  char *anchor_00;
  t_float tVar7;
  t_float tVar8;
  double dVar9;
  undefined8 in_stack_fffffffffffffd20;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar11;
  t_float local_188;
  int tickpix_3;
  int tickpix_2;
  t_float lbound;
  t_float ubound;
  int tickpix_1;
  int tickpix;
  t_float lpix;
  t_float upix;
  char *tags3 [3];
  int fs;
  char *xlabelanchor;
  char *ylabelanchor;
  t_symbol *arrayname;
  t_gobj *g_1;
  t_float f;
  int i;
  int y2;
  int x2;
  int y1;
  int x1;
  t_gobj *g;
  char *tags2 [2];
  char tag [50];
  _glist *x;
  int vis_local;
  _glist *parent_glist_local;
  t_gobj *gr_local;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  g = (t_gobj *)(tags2 + 1);
  tags2[0] = "graph";
  if ((*(ushort *)&gr[0xe].g_next >> 8 & 1) == 0) {
    text_vis(gr,parent_glist,vis);
  }
  else {
    if ((vis != 0) && (iVar1 = canvas_showtext((_glist *)gr), iVar1 != 0)) {
      p_Var5 = glist_findrtext(parent_glist,(t_text *)gr);
      rtext_draw(p_Var5);
    }
    graph_getrect(gr,parent_glist,&x2,&y2,&i,(int *)&f);
    if (vis == 0) {
      p_Var5 = glist_findrtext(parent_glist,(t_text *)gr);
      rtext_erase(p_Var5);
    }
    sprintf((char *)(tags2 + 1),"graph%lx",gr);
    if (vis == 0) {
      glist_eraseiofor(parent_glist,(t_object *)gr,(char *)(tags2 + 1));
    }
    else {
      glist_drawiofor(parent_glist,(t_object *)gr,1,(char *)(tags2 + 1),x2,y2,i,(int)f);
    }
    if (((ulong)gr[0xe].g_next & 1) == 0) {
      if (vis == 0) {
        p_Var6 = glist_getcanvas((_glist *)gr[4].g_next);
        pdgui_vmess((char *)0x0,"crs",p_Var6,"delete",tags2 + 1);
        for (_y1 = gr[3].g_pd; _y1 != (t_pd)0x0; _y1 = (t_pd)_y1->c_helpname) {
          gobj_vis((t_gobj *)_y1,(_glist *)gr,0);
        }
      }
      else {
        anchor = "e";
        if ((*(float *)&gr[5].g_next + *(float *)&gr[6].g_pd) * 0.5 < *(float *)&gr[0xb].g_next) {
          anchor = "w";
        }
        anchor_00 = "n";
        if ((*(float *)((long)&gr[5].g_next + 4) + *(float *)((long)&gr[6].g_pd + 4)) * 0.5 <
            *(float *)&gr[9].g_next) {
          anchor_00 = "s";
        }
        iVar1 = glist_getfont((_glist *)gr);
        iVar2 = glist_getzoom((_glist *)gr);
        tags3[2]._4_4_ = sys_hostfontsize(iVar1,iVar2);
        _lpix = tags2 + 1;
        tags3[0] = "label";
        tags3[1] = "graph";
        p_Var6 = glist_getcanvas((_glist *)gr[4].g_next);
        iVar4 = x2;
        iVar2 = y2;
        iVar1 = i;
        tVar7 = f;
        iVar3 = glist_getzoom((_glist *)gr);
        pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rS",p_Var6,"create","line",(ulong)(uint)iVar4,
                    iVar2,CONCAT44(uVar10,iVar4),tVar7,iVar1,tVar7,iVar1,iVar2,iVar4,iVar2,"-width",
                    iVar3,"-capstyle","projecting","-tags",CONCAT44(uVar11,2),&g);
        if (y2 < (int)f) {
          local_188 = (t_float)y2;
        }
        else {
          local_188 = f;
        }
        g_1._4_4_ = (int)local_188 + -1;
        for (arrayname = (t_symbol *)gr[3].g_pd; arrayname != (t_symbol *)0x0;
            arrayname = (t_symbol *)arrayname->s_thing) {
          if (((_class *)arrayname->s_name == garray_class) &&
             (iVar1 = garray_getname((_garray *)arrayname,(t_symbol **)&ylabelanchor), iVar1 == 0))
          {
            iVar1 = glist_fontheight((_glist *)gr);
            g_1._4_4_ = g_1._4_4_ - iVar1;
            _graph_create_text((_glist *)gr,x2,g_1._4_4_,*(char **)ylabelanchor,"nw",-tags3[2]._4_4_
                               ,3,(char **)&lpix);
          }
        }
        if (*(int *)&gr[8].g_next != 0) {
          tVar7 = (t_float)y2;
          if ((int)f < y2) {
            tVar7 = f;
            f = (t_float)y2;
          }
          tickpix = (int)(float)(int)f;
          tickpix_1 = (int)(float)(int)tVar7;
          g_1._4_4_ = 0;
          for (g_1._0_4_ = *(float *)&gr[8].g_pd;
              g_1._0_4_ < *(float *)&gr[6].g_pd * 0.99 + *(float *)&gr[5].g_next * 0.01;
              g_1._0_4_ = *(float *)((long)&gr[8].g_pd + 4) + g_1._0_4_) {
            iVar1 = 4;
            if (g_1._4_4_ % *(int *)&gr[8].g_next != 0) {
              iVar1 = 2;
            }
            tVar7 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            tVar8 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,(int)tVar7,(int)(float)tickpix,(int)tVar8,
                                (int)(float)tickpix - iVar1,(char **)&g);
            tVar7 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            tVar8 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,(int)tVar7,(int)(float)tickpix_1,(int)tVar8,
                                (int)(float)tickpix_1 + iVar1,(char **)&g);
            g_1._4_4_ = g_1._4_4_ + 1;
          }
          g_1._4_4_ = 1;
          for (g_1._0_4_ = *(float *)&gr[8].g_pd - *(float *)((long)&gr[8].g_pd + 4);
              *(float *)&gr[5].g_next * 0.99 + *(float *)&gr[6].g_pd * 0.01 < g_1._0_4_;
              g_1._0_4_ = g_1._0_4_ - *(float *)((long)&gr[8].g_pd + 4)) {
            iVar1 = 4;
            if (g_1._4_4_ % *(int *)&gr[8].g_next != 0) {
              iVar1 = 2;
            }
            tVar7 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            tVar8 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,(int)tVar7,(int)(float)tickpix,(int)tVar8,
                                (int)(float)tickpix - iVar1,(char **)&g);
            tVar7 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            tVar8 = glist_xtopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,(int)tVar7,(int)(float)tickpix_1,(int)tVar8,
                                (int)(float)tickpix_1 + iVar1,(char **)&g);
            g_1._4_4_ = g_1._4_4_ + 1;
          }
        }
        if (*(int *)((long)&gr[10].g_pd + 4) != 0) {
          if (*(float *)((long)&gr[5].g_next + 4) <= *(float *)((long)&gr[6].g_pd + 4)) {
            tickpix_2 = *(int *)((long)&gr[6].g_pd + 4);
            tickpix_3 = *(int *)((long)&gr[5].g_next + 4);
          }
          else {
            tickpix_2 = *(int *)((long)&gr[5].g_next + 4);
            tickpix_3 = *(int *)((long)&gr[6].g_pd + 4);
          }
          g_1._4_4_ = 0;
          for (g_1._0_4_ = *(float *)((long)&gr[9].g_next + 4); iVar1 = x2,
              g_1._0_4_ < (float)tickpix_2 * 0.99 + (float)tickpix_3 * 0.01;
              g_1._0_4_ = *(float *)&gr[10].g_pd + g_1._0_4_) {
            iVar2 = 4;
            if (g_1._4_4_ % *(int *)((long)&gr[10].g_pd + 4) != 0) {
              iVar2 = 2;
            }
            tVar7 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            iVar4 = x2 + iVar2;
            tVar8 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,iVar1,(int)tVar7,iVar4,(int)tVar8,(char **)&g);
            iVar1 = i;
            tVar7 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            iVar2 = i - iVar2;
            tVar8 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,iVar1,(int)tVar7,iVar2,(int)tVar8,(char **)&g);
            g_1._4_4_ = g_1._4_4_ + 1;
          }
          g_1._4_4_ = 1;
          for (g_1._0_4_ = *(float *)((long)&gr[9].g_next + 4) - *(float *)&gr[10].g_pd; iVar1 = x2,
              (float)tickpix_3 * 0.99 + (float)tickpix_2 * 0.01 < g_1._0_4_;
              g_1._0_4_ = g_1._0_4_ - *(float *)&gr[10].g_pd) {
            iVar2 = 4;
            if (g_1._4_4_ % *(int *)((long)&gr[10].g_pd + 4) != 0) {
              iVar2 = 2;
            }
            tVar7 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            iVar4 = x2 + iVar2;
            tVar8 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,iVar1,(int)tVar7,iVar4,(int)tVar8,(char **)&g);
            iVar1 = i;
            tVar7 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            iVar2 = i - iVar2;
            tVar8 = glist_ytopixels((_glist *)gr,g_1._0_4_);
            _graph_create_line4((_glist *)gr,iVar1,(int)tVar7,iVar2,(int)tVar8,(char **)&g);
            g_1._4_4_ = g_1._4_4_ + 1;
          }
        }
        for (g_1._4_4_ = 0; g_1._4_4_ < *(int *)((long)&gr[8].g_next + 4); g_1._4_4_ = g_1._4_4_ + 1
            ) {
          dVar9 = atof((&(gr[9].g_pd)->c_name)[g_1._4_4_]->s_name);
          tVar7 = glist_xtopixels((_glist *)gr,(float)dVar9);
          tVar8 = glist_ytopixels((_glist *)gr,*(t_float *)&gr[9].g_next);
          _graph_create_text((_glist *)gr,(int)tVar7,(int)tVar8,
                             (&(gr[9].g_pd)->c_name)[g_1._4_4_]->s_name,anchor_00,-tags3[2]._4_4_,3,
                             (char **)&lpix);
        }
        for (g_1._4_4_ = 0; g_1._4_4_ < *(int *)&gr[10].g_next; g_1._4_4_ = g_1._4_4_ + 1) {
          tVar7 = glist_xtopixels((_glist *)gr,*(t_float *)&gr[0xb].g_next);
          dVar9 = atof((&(gr[0xb].g_pd)->c_name)[g_1._4_4_]->s_name);
          tVar8 = glist_ytopixels((_glist *)gr,(float)dVar9);
          _graph_create_text((_glist *)gr,(int)tVar7,(int)tVar8,
                             (&(gr[0xb].g_pd)->c_name)[g_1._4_4_]->s_name,anchor,-tags3[2]._4_4_,3,
                             (char **)&lpix);
        }
        for (arrayname = (t_symbol *)gr[3].g_pd; arrayname != (t_symbol *)0x0;
            arrayname = (t_symbol *)arrayname->s_thing) {
          gobj_vis((t_gobj *)arrayname,(_glist *)gr,1);
        }
      }
    }
    else if (vis == 0) {
      p_Var6 = glist_getcanvas((_glist *)gr[4].g_next);
      pdgui_vmess((char *)0x0,"crs",p_Var6,"delete",tags2 + 1);
    }
    else {
      p_Var6 = glist_getcanvas((_glist *)gr[4].g_next);
      iVar1 = glist_getzoom((_glist *)gr);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rr rS",p_Var6,"create","polygon",(ulong)(uint)x2
                  ,y2,CONCAT44(uVar10,x2),f,i,f,i,y2,x2,y2,"-width",iVar1,"-fill","#c0c0c0",
                  "-joinstyle","miter","-tags",2,&g);
    }
  }
  return;
}

Assistant:

static void graph_vis(t_gobj *gr, t_glist *parent_glist, int vis)
{
    t_glist *x = (t_glist *)gr;
    char tag[50];
    const char *tags2[] = {tag, "graph" };
    t_gobj *g;
    int x1, y1, x2, y2;
        /* ordinary subpatches: just act like a text object */
    if (!x->gl_isgraph)
    {
        text_widgetbehavior.w_visfn(gr, parent_glist, vis);
        return;
    }

    if (vis && canvas_showtext(x))
        rtext_draw(glist_findrtext(parent_glist, &x->gl_obj));
    graph_getrect(gr, parent_glist, &x1, &y1, &x2, &y2);
    if (!vis)
        rtext_erase(glist_findrtext(parent_glist, &x->gl_obj));

    sprintf(tag, "graph%lx", (t_int)x);
    if (vis)
        glist_drawiofor(parent_glist, &x->gl_obj, 1,
            tag, x1, y1, x2, y2);
    else glist_eraseiofor(parent_glist, &x->gl_obj, tag);
        /* if we look like a graph but have been moved to a toplevel,
        just show the bounding rectangle */
    if (x->gl_havewindow)
    {
        if (vis)
            pdgui_vmess(0, "crr iiiiiiiiii ri rr rr rS",
                glist_getcanvas(x->gl_owner), "create", "polygon",
                x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                "-width", glist_getzoom(x),
                "-fill", "#c0c0c0",
                "-joinstyle", "miter",
                "-tags", 2, tags2);
        else
            pdgui_vmess(0, "crs",
                glist_getcanvas(x->gl_owner), "delete", tag);
        return;
    }
        /* otherwise draw (or erase) us as a graph inside another glist. */
    if (vis)
    {
        int i;
        t_float f;
        t_gobj *g;
        t_symbol *arrayname;
        char *ylabelanchor =
            (x->gl_ylabelx > 0.5*(x->gl_x1 + x->gl_x2) ? "w" : "e");
        char *xlabelanchor =
            (x->gl_xlabely > 0.5*(x->gl_y1 + x->gl_y2) ? "s" : "n");
        int fs = sys_hostfontsize(glist_getfont(x), glist_getzoom(x));
        const char *tags3[] = {tag, "label", "graph" };

            /* draw a rectangle around the graph */
        pdgui_vmess(0, "crr iiiiiiiiii ri rr rS",
                  glist_getcanvas(x->gl_owner),
                  "create", "line",
                  x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                  "-width", glist_getzoom(x),
                  "-capstyle", "projecting",
                  "-tags", 2, tags2);
            /* if there's just one "garray" in the graph, write its name
                along the top */
        for (i = (y1 < y2 ? y1 : y2)-1, g = x->gl_list; g; g = g->g_next)
            if (g->g_pd == garray_class &&
                !garray_getname((t_garray *)g, &arrayname))
        {
            i -= glist_fontheight(x);
            _graph_create_text(x,
                x1, i,
                arrayname->s_name,
                "nw", -fs,
                3, tags3);
        }

            /* draw ticks on horizontal borders.  If lperb field is
            zero, this is disabled. */
        if (x->gl_xtick.k_lperb)
        {
            t_float upix, lpix;
            if (y2 < y1)
                upix = y1, lpix = y2;
            else upix = y2, lpix = y1;
            for (i = 0, f = x->gl_xtick.k_point;
                f < 0.99 * x->gl_x2 + 0.01*x->gl_x1; i++,
                    f += x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
            for (i = 1, f = x->gl_xtick.k_point - x->gl_xtick.k_inc;
                f > 0.99 * x->gl_x1 + 0.01*x->gl_x2;
                    i++, f -= x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
        }

            /* draw ticks in vertical borders*/
        if (x->gl_ytick.k_lperb)
        {
            t_float ubound, lbound;
            if (x->gl_y2 < x->gl_y1)
                ubound = x->gl_y1, lbound = x->gl_y2;
            else ubound = x->gl_y2, lbound = x->gl_y1;
            for (i = 0, f = x->gl_ytick.k_point;
                f < 0.99 * ubound + 0.01 * lbound;
                    i++, f += x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
            for (i = 1, f = x->gl_ytick.k_point - x->gl_ytick.k_inc;
                f > 0.99 * lbound + 0.01 * ubound;
                    i++, f -= x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
        }
            /* draw x labels */
        for (i = 0; i < x->gl_nxlabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, atof(x->gl_xlabel[i]->s_name)),
                (int)glist_ytopixels(x, x->gl_xlabely),
                x->gl_xlabel[i]->s_name,
                xlabelanchor, -fs,
                3, tags3);
            /* draw y labels */
        for (i = 0; i < x->gl_nylabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, x->gl_ylabelx),
                (int)glist_ytopixels(x, atof(x->gl_ylabel[i]->s_name)),
                x->gl_ylabel[i]->s_name,
                ylabelanchor, -fs,
                3, tags3);

            /* draw contents of graph as glist */
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 1);
    }
    else
    {
        pdgui_vmess(0, "crs", glist_getcanvas(x->gl_owner), "delete", tag);
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 0);
    }
}